

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O2

GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
 BCL::
 local_malloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
           (size_t size)

{
  ulong uVar1;
  ulong *puVar2;
  size_t sVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *puVar6;
  size_t sVar7;
  ulong uVar8;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar9;
  
  if (bcl_finalized == '\0') {
    std::mutex::lock((mutex *)malloc_mutex);
    puVar4 = smem_heap;
    uVar8 = size * 0x20 + 0x3f & 0xffffffffffffffc0;
    for (puVar6 = (ulong *)&flist; puVar6 = (ulong *)*puVar6, puVar6 != (ulong *)0x0;
        puVar6 = puVar6 + 2) {
      uVar1 = *puVar6;
      if (uVar8 <= uVar1) {
        if (uVar8 + 0x80 < uVar1) {
          puVar4 = (ulong *)((long)puVar6 + uVar8 + 0x40);
          *puVar4 = (uVar1 - uVar8) - 0x40;
          uVar1 = puVar6[1];
          *(ulong *)((long)puVar6 + uVar8 + 0x48) = uVar1;
          uVar5 = puVar6[2];
          *(ulong *)((long)puVar6 + uVar8 + 0x50) = uVar5;
          if (uVar1 != 0) {
            *(ulong **)(uVar1 + 0x10) = puVar4;
            uVar5 = puVar6[2];
          }
          if (uVar5 != 0) {
            *(ulong **)(uVar5 + 8) = puVar4;
          }
          *puVar6 = uVar8;
          puVar6[1] = 0;
          puVar6[2] = 0;
          puVar2 = smem_heap;
          if (puVar6 == flist) {
            flist = puVar4;
          }
        }
        else {
          uVar8 = puVar6[1];
          puVar4 = (ulong *)puVar6[2];
          if (uVar8 != 0) {
            *(ulong **)(uVar8 + 0x10) = puVar4;
          }
          if (puVar4 != (ulong *)0x0) {
            puVar4[1] = uVar8;
          }
          if (puVar6 == flist) {
            flist = puVar4;
          }
          puVar6[1] = 0;
          puVar6[2] = 0;
          puVar2 = smem_heap;
        }
        goto LAB_0010459b;
      }
    }
    *smem_heap = uVar8;
    puVar2 = (ulong *)((long)puVar4 + uVar8 + 0x40);
    puVar4[1] = 0;
    puVar4[2] = 0;
    puVar6 = puVar4;
    if (puVar2 <= (ulong *)(smem_base_ptr + shared_segment_size)) {
LAB_0010459b:
      smem_heap = puVar2;
      pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      sVar7 = (long)puVar6 + (0x40 - smem_base_ptr);
      sVar3 = my_rank;
      goto LAB_001045b5;
    }
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  }
  sVar3 = 0;
  sVar7 = 0;
LAB_001045b5:
  GVar9.ptr = sVar7;
  GVar9.rank = sVar3;
  return GVar9;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}